

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  ImVec2 IVar1;
  bool bVar2;
  bool bVar3;
  ImRect *pIVar4;
  ImU32 col;
  ImVec2 *pIVar5;
  float fVar6;
  uint uVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  IVar1 = *pos_min;
  local_68 = IVar1;
  local_60 = draw_list;
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_58 = ZEXT416((uint)IVar1.x);
    IVar8 = CalcTextSize(text,text_display_end,false,0.0);
    fVar9 = (float)local_58._0_4_;
  }
  else {
    IVar8 = *text_size_if_known;
    fVar9 = IVar1.x;
  }
  fVar6 = IVar1.y;
  pIVar5 = &clip_rect->Max;
  pIVar4 = clip_rect;
  if (clip_rect == (ImRect *)0x0) {
    pIVar5 = pos_max;
    pIVar4 = (ImRect *)pos_min;
  }
  bVar2 = true;
  if (IVar8.x + fVar9 < pIVar5->x) {
    bVar2 = pIVar5->y <= IVar8.y + fVar6;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar3 = true;
    if ((clip_rect->Min).x <= fVar9) {
      bVar3 = fVar6 < (clip_rect->Min).y;
    }
    bVar2 = (bool)(bVar2 | bVar3);
  }
  if (0.0 < align->x) {
    fVar10 = ((pos_max->x - fVar9) - IVar8.x) * align->x + fVar9;
    uVar7 = -(uint)(fVar10 <= fVar9);
    local_68.x = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)fVar10);
  }
  if (0.0 < align->y) {
    fVar9 = ((pos_max->y - fVar6) - IVar8.y) * align->y + fVar6;
    uVar7 = -(uint)(fVar9 <= fVar6);
    local_68.y = (float)(uVar7 & (uint)fVar6 | ~uVar7 & (uint)fVar9);
  }
  if (bVar2) {
    local_34 = pIVar5->y;
    local_40 = pIVar4->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_38 = pIVar5->x;
    col = GetColorU32(0,1.0);
  }
  else {
    col = GetColorU32(0,1.0);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(local_60,(ImFont *)0x0,0.0,&local_68,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}